

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

string * __thiscall
cnn::SumColumns::as_string
          (string *__return_storage_ptr__,SumColumns *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  ostringstream s;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar1 = std::operator<<((ostream *)&s,"sum_cols(matrix=");
  std::operator<<(poVar1,(string *)
                         (arg_names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  if ((long)(arg_names->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arg_names->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x40) {
    poVar1 = std::operator<<((ostream *)&s,", col_weighting=");
    std::operator<<(poVar1,(string *)
                           ((arg_names->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::operator<<((ostream *)&s,')');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

string SumColumns::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "sum_cols(matrix=" << arg_names[0];
  if (arg_names.size() == 2) s << ", col_weighting=" << arg_names[1];
  s << ')';
  return s.str();
}